

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Multiqueues.h
# Opt level: O1

int __thiscall Multiqueues<int>::getTopValue(Multiqueues<int> *this,int queueIndex)

{
  PriorityQueue *pPVar1;
  pointer p_Var2;
  int iVar3;
  
  pPVar1 = this->internalQueues;
  p_Var2 = pPVar1[queueIndex].super_type.q_.q_.
           super__Vector_base<std::_List_iterator<std::pair<int,_unsigned_long>_>,_std::allocator<std::_List_iterator<std::pair<int,_unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (p_Var2 == pPVar1[queueIndex].super_type.q_.q_.
                super__Vector_base<std::_List_iterator<std::pair<int,_unsigned_long>_>,_std::allocator<std::_List_iterator<std::pair<int,_unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    iVar3 = -1;
  }
  else {
    iVar3 = *(int *)&p_Var2->_M_node[1]._M_next;
    boost::heap::detail::
    priority_queue_mutable_wrapper<boost::heap::detail::d_ary_heap<int,_boost::parameter::aux::flat_like_arg_list<boost::parameter::aux::flat_like_arg_tuple<boost::heap::tag::arity,_boost::heap::arity<2U>,_std::integral_constant<bool,_true>_>,_boost::parameter::aux::flat_like_arg_tuple<boost::heap::tag::mutable_,_boost::heap::mutable_<true>,_std::integral_constant<bool,_true>_>_>,_boost::heap::detail::nop_index_updater>_>
    ::pop(&pPVar1[queueIndex].super_type);
  }
  pthread_mutex_unlock((pthread_mutex_t *)(this->locks + queueIndex));
  return iVar3;
}

Assistant:

T getTopValue(const int queueIndex) const {
        int topValue = -1;
        if (!internalQueues[queueIndex].empty()) {
            topValue = internalQueues[queueIndex].top();
            internalQueues[queueIndex].pop();
        }
        locks[queueIndex].unlock();
        return topValue;
    }